

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringFunctions.cpp
# Opt level: O0

string * IO::fileToString(string *__return_storage_ptr__,string *fileName)

{
  char *pcVar1;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  allocator<char> local_261;
  undefined1 local_260 [12];
  undefined1 local_250 [12];
  undefined1 local_240 [8];
  string fileInString;
  ifstream fin;
  string *fileName_local;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream((istream_type *)(fileInString.field_2._M_local_buf + 8),pcVar1,_S_in);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_250,
             (istream_type *)(fileInString.field_2._M_local_buf + 8));
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_260);
  std::allocator<char>::allocator();
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_250._0_8_;
  __beg._M_c = local_250._8_4_;
  __end._12_4_ = 0;
  __end._M_sbuf = (streambuf_type *)local_260._0_8_;
  __end._M_c = local_260._8_4_;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((string *)local_240,__beg,__end,&local_261);
  std::allocator<char>::~allocator(&local_261);
  convertToCaps(__return_storage_ptr__,(string *)local_240);
  std::__cxx11::string::~string((string *)local_240);
  std::ifstream::~ifstream((void *)((long)&fileInString.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

string
IO::fileToString(const string& fileName)
{
    ifstream fin(fileName.c_str(), ios::in);

    string fileInString((istreambuf_iterator<char>(fin)),
                         istreambuf_iterator<char>());

    return convertToCaps(fileInString);
}